

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_paramhlp.c
# Opt level: O0

ParameterError file2memory(char **bufp,size_t *size,FILE *file)

{
  void *pvVar1;
  size_t sVar2;
  size_t local_50;
  size_t alloc;
  size_t nread;
  size_t nused;
  char *buffer;
  char *newbuf;
  FILE *file_local;
  size_t *size_local;
  char **bufp_local;
  
  nused = 0;
  nread = 0;
  if (file != (FILE *)0x0) {
    local_50 = 0x200;
    do {
      if ((nused == 0) || (pvVar1 = (void *)nused, local_50 == nread)) {
        if (0x7fffffffffffffff < local_50 + 1) {
          free((void *)nused);
          return PARAM_NO_MEM;
        }
        local_50 = local_50 * 2;
        pvVar1 = realloc((void *)nused,local_50 + 1);
        if (pvVar1 == (void *)0x0) {
          free((void *)nused);
          return PARAM_NO_MEM;
        }
      }
      nused = (size_t)pvVar1;
      sVar2 = fread((void *)(nused + nread),1,local_50 - nread,(FILE *)file);
      nread = sVar2 + nread;
    } while (sVar2 != 0);
    *(undefined1 *)(nused + nread) = 0;
    pvVar1 = (void *)nused;
    if ((local_50 != nread) && (pvVar1 = realloc((void *)nused,nread + 1), pvVar1 == (void *)0x0)) {
      free((void *)nused);
      return PARAM_NO_MEM;
    }
    nused = (size_t)pvVar1;
    if (nread == 0) {
      free((void *)nused);
      nused = 0;
    }
  }
  *size = nread;
  *bufp = (char *)nused;
  return PARAM_OK;
}

Assistant:

ParameterError file2memory(char **bufp, size_t *size, FILE *file)
{
  char *newbuf;
  char *buffer = NULL;
  size_t nused = 0;

  if(file) {
    size_t nread;
    size_t alloc = 512;
    do {
      if(!buffer || (alloc == nused)) {
        /* size_t overflow detection for huge files */
        if(alloc + 1 > ((size_t)-1)/2) {
          Curl_safefree(buffer);
          return PARAM_NO_MEM;
        }
        alloc *= 2;
        /* allocate an extra char, reserved space, for null termination */
        newbuf = realloc(buffer, alloc + 1);
        if(!newbuf) {
          Curl_safefree(buffer);
          return PARAM_NO_MEM;
        }
        buffer = newbuf;
      }
      nread = fread(buffer + nused, 1, alloc-nused, file);
      nused += nread;
    } while(nread);
    /* null terminate the buffer in case it's used as a string later */
    buffer[nused] = '\0';
    /* free trailing slack space, if possible */
    if(alloc != nused) {
      newbuf = realloc(buffer, nused + 1);
      if(!newbuf) {
        Curl_safefree(buffer);
        return PARAM_NO_MEM;
      }
      buffer = newbuf;
    }
    /* discard buffer if nothing was read */
    if(!nused) {
      Curl_safefree(buffer); /* no string */
    }
  }
  *size = nused;
  *bufp = buffer;
  return PARAM_OK;
}